

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hh
# Opt level: O0

void qpdf::util::increment(string *s,int tail)

{
  bool bVar1;
  reference pcVar2;
  undefined1 local_30 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  reverse_iterator end;
  int tail_local;
  string *s_local;
  
  std::__cxx11::string::rend();
  std::__cxx11::string::rbegin();
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator+(&local_28,(difference_type)local_30);
  while( true ) {
    bVar1 = std::operator!=(&local_28,&it);
    if (!bVar1) {
      std::__cxx11::string::insert((ulong)s,0,'\x01');
      return;
    }
    pcVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&local_28);
    *pcVar2 = *pcVar2 + '\x01';
    pcVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&local_28);
    if (*pcVar2 != ':') break;
    pcVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&local_28);
    *pcVar2 = '0';
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

inline void
    increment(std::string& s, int tail = 0)
    {
        auto end = s.rend();
        for (auto it = s.rbegin() + tail; it != end; ++it) {
            ++*it;
            if (*it != ':') {
                return;
            }
            *it = '0';
        }
        s.insert(0, 1, '1');
    }